

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O3

void __thiscall NaPNStatistics::post_action(NaPNStatistics *this)

{
  NaPetriCnInput::commit_data(&this->signal);
  if ((this->nGapWidth != 0) && (this->nGapAct <= this->nGapWidth - 1)) {
    return;
  }
  NaPetriCnOutput::commit_data(&this->stat);
  return;
}

Assistant:

void
NaPNStatistics::post_action ()
{
  signal.commit_data();

  if(nGapAct >= nGapWidth && nGapWidth > 0
     || 0 == nGapWidth)
    // commit data each activations (continuous computation) or at the
    // end of each gap
    stat.commit_data();
}